

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O0

uchar __thiscall
PCCompatible::IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::in<unsigned_char>
          (IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1> *this,uint16_t port)

{
  uint8_t uVar1;
  uint uVar2;
  ssize_t sVar3;
  size_t in_RCX;
  void *in_RDX;
  int __fd;
  undefined6 in_register_00000032;
  uint16_t port_local;
  IO<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1> *this_local;
  
  uVar2 = (uint)port;
  if (uVar2 == 0) {
    this_local._7_1_ = i8237::read<0>(&this->dma_->controller);
  }
  else if (uVar2 == 1) {
    this_local._7_1_ = i8237::read<1>(&this->dma_->controller);
  }
  else if (uVar2 == 2) {
    this_local._7_1_ = i8237::read<2>(&this->dma_->controller);
  }
  else if (uVar2 == 3) {
    this_local._7_1_ = i8237::read<3>(&this->dma_->controller);
  }
  else if (uVar2 == 4) {
    this_local._7_1_ = i8237::read<4>(&this->dma_->controller);
  }
  else if (uVar2 == 5) {
    this_local._7_1_ = i8237::read<5>(&this->dma_->controller);
  }
  else if (uVar2 == 6) {
    this_local._7_1_ = i8237::read<6>(&this->dma_->controller);
  }
  else if (uVar2 == 7) {
    this_local._7_1_ = i8237::read<7>(&this->dma_->controller);
  }
  else if (uVar2 == 8) {
    this_local._7_1_ = i8237::read<8>(&this->dma_->controller);
  }
  else {
    if ((uVar2 != 9) && (1 < uVar2 - 0xb)) {
      if (uVar2 == 0xd) {
        uVar1 = i8237::read<13>(&this->dma_->controller);
        return uVar1;
      }
      if (uVar2 != 0xf) {
        if (uVar2 == 0x20) {
          uVar1 = PIC::read<0>(this->pic_);
          return uVar1;
        }
        if (uVar2 == 0x21) {
          uVar1 = PIC::read<1>(this->pic_);
          return uVar1;
        }
        if (uVar2 == 0x40) {
          uVar1 = i8253<false,_PCCompatible::PITObserver>::read<0>(this->pit_);
          return uVar1;
        }
        if (uVar2 == 0x41) {
          uVar1 = i8253<false,_PCCompatible::PITObserver>::read<1>(this->pit_);
          return uVar1;
        }
        if (uVar2 == 0x42) {
          uVar1 = i8253<false,_PCCompatible::PITObserver>::read<2>(this->pit_);
          return uVar1;
        }
        if (uVar2 - 0x60 < 0x10) {
          sVar3 = Intel::i8255::i8255<PCCompatible::i8255PortHandler>::read
                            (this->ppi_,(uint)port,in_RDX,in_RCX);
          return (uchar)sVar3;
        }
        __fd = (int)CONCAT62(in_register_00000032,port);
        if (uVar2 == 0x71) {
          sVar3 = RTC::read(this->rtc_,__fd,in_RDX,in_RCX);
          return (uchar)sVar3;
        }
        if (uVar2 == 0x80) {
          uVar1 = DMAPages::page<0>(&this->dma_->pages);
          return uVar1;
        }
        if (uVar2 == 0x81) {
          uVar1 = DMAPages::page<1>(&this->dma_->pages);
          return uVar1;
        }
        if (uVar2 == 0x82) {
          uVar1 = DMAPages::page<2>(&this->dma_->pages);
          return uVar1;
        }
        if (uVar2 == 0x83) {
          uVar1 = DMAPages::page<3>(&this->dma_->pages);
          return uVar1;
        }
        if (uVar2 == 0x84) {
          uVar1 = DMAPages::page<4>(&this->dma_->pages);
          return uVar1;
        }
        if (uVar2 == 0x85) {
          uVar1 = DMAPages::page<5>(&this->dma_->pages);
          return uVar1;
        }
        if (uVar2 == 0x86) {
          uVar1 = DMAPages::page<6>(&this->dma_->pages);
          return uVar1;
        }
        if (uVar2 == 0x87) {
          uVar1 = DMAPages::page<7>(&this->dma_->pages);
          return uVar1;
        }
        if ((((uVar2 != 0x201) && (2 < uVar2 - 0x278)) && (7 < uVar2 - 0x2e8)) &&
           (((7 < uVar2 - 0x2f8 && (2 < uVar2 - 0x378)) && ((uVar2 != 0x3b8 && (2 < uVar2 - 0x3bc)))
            ))) {
          if (uVar2 == 0x3da) {
            uVar1 = CGA::read<10>(this->video_);
            return uVar1;
          }
          if (7 < uVar2 - 1000) {
            if (uVar2 == 0x3f4) {
              uVar1 = FloppyController::status(this->fdc_);
              return uVar1;
            }
            if (uVar2 == 0x3f5) {
              sVar3 = FloppyController::read(this->fdc_,__fd,in_RDX,in_RCX);
              return (uchar)sVar3;
            }
            if (7 < uVar2 - 0x3f8) {
              printf("Unhandled in: %04x\n",(ulong)port);
            }
          }
        }
      }
    }
    this_local._7_1_ = 0xff;
  }
  return this_local._7_1_;
}

Assistant:

IntT in([[maybe_unused]] uint16_t port) {
			switch(port) {
				default:
					printf("Unhandled in: %04x\n", port);
				break;

				case 0x0000:	return dma_.controller.read<0x0>();
				case 0x0001:	return dma_.controller.read<0x1>();
				case 0x0002:	return dma_.controller.read<0x2>();
				case 0x0003:	return dma_.controller.read<0x3>();
				case 0x0004:	return dma_.controller.read<0x4>();
				case 0x0005:	return dma_.controller.read<0x5>();
				case 0x0006:	return dma_.controller.read<0x6>();
				case 0x0007:	return dma_.controller.read<0x7>();
				case 0x0008:	return dma_.controller.read<0x8>();
				case 0x000d:	return dma_.controller.read<0xd>();

				case 0x0009:	case 0x000b:
				case 0x000c:	case 0x000f:
					// DMA area, but it doesn't respond.
				break;

				case 0x0020:	return pic_.read<0>();
				case 0x0021:	return pic_.read<1>();

				case 0x0040:	return pit_.read<0>();
				case 0x0041:	return pit_.read<1>();
				case 0x0042:	return pit_.read<2>();

				case 0x0060:	case 0x0061:	case 0x0062:	case 0x0063:
				case 0x0064:	case 0x0065:	case 0x0066:	case 0x0067:
				case 0x0068:	case 0x0069:	case 0x006a:	case 0x006b:
				case 0x006c:	case 0x006d:	case 0x006e:	case 0x006f:
				return ppi_.read(port);

				case 0x0071:	return rtc_.read();

				case 0x0080:	return dma_.pages.page<0>();
				case 0x0081:	return dma_.pages.page<1>();
				case 0x0082:	return dma_.pages.page<2>();
				case 0x0083:	return dma_.pages.page<3>();
				case 0x0084:	return dma_.pages.page<4>();
				case 0x0085:	return dma_.pages.page<5>();
				case 0x0086:	return dma_.pages.page<6>();
				case 0x0087:	return dma_.pages.page<7>();

				case 0x0201:	break;		// Ignore game port.

				case 0x0278:	case 0x0279:	case 0x027a:
				case 0x0378:	case 0x0379:	case 0x037a:
				case 0x03bc:	case 0x03bd:	case 0x03be:
					// Ignore parallel port accesses.
				break;

				case 0x03f4:	return fdc_.status();
				case 0x03f5:	return fdc_.read();

				case 0x03b8:
					if constexpr (video == Target::VideoAdaptor::MDA) {
						return video_.template read<0x8>();
					}
				break;

				case 0x3da:
					if constexpr (video == Target::VideoAdaptor::CGA) {
						return video_.template read<0xa>();
					}
				break;

				case 0x02e8:	case 0x02e9:	case 0x02ea:	case 0x02eb:
				case 0x02ec:	case 0x02ed:	case 0x02ee:	case 0x02ef:
				case 0x02f8:	case 0x02f9:	case 0x02fa:	case 0x02fb:
				case 0x02fc:	case 0x02fd:	case 0x02fe:	case 0x02ff:
				case 0x03e8:	case 0x03e9:	case 0x03ea:	case 0x03eb:
				case 0x03ec:	case 0x03ed:	case 0x03ee:	case 0x03ef:
				case 0x03f8:	case 0x03f9:	case 0x03fa:	case 0x03fb:
				case 0x03fc:	case 0x03fd:	case 0x03fe:	case 0x03ff:
					// Ignore serial port accesses.
				break;
			}
			return 0xff;
		}